

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar3 = stbi__jpeg_huff_decode(j,hdc);
  pcVar6 = "bad huffman code";
  if (uVar3 < 0x10) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (uVar3 == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = stbi__extend_receive(j,uVar3);
    }
    iVar8 = j->img_comp[b].dc_pred;
    iVar5 = stbi__addints_valid(iVar8,iVar4);
    if (iVar5 == 0) {
      pcVar6 = "bad delta";
    }
    else {
      iVar8 = iVar8 + iVar4;
      j->img_comp[b].dc_pred = iVar8;
      uVar2 = *dequant;
      iVar4 = stbi__mul2shorts_valid(iVar8,(uint)uVar2);
      if (iVar4 != 0) {
        *data = uVar2 * (short)iVar8;
        iVar4 = 1;
        do {
          if (j->code_bits < 0x10) {
            stbi__grow_buffer_unsafe(j);
          }
          uVar2 = fac[j->code_buffer >> 0x17];
          if (uVar2 == 0) {
            uVar3 = stbi__jpeg_huff_decode(j,hac);
            if ((int)uVar3 < 0) goto LAB_0014e481;
            if ((uVar3 & 0xf) == 0) {
              if (uVar3 != 0xf0) {
                return 1;
              }
              iVar4 = iVar4 + 0x10;
            }
            else {
              lVar7 = (ulong)(uVar3 >> 4) + (long)iVar4;
              iVar4 = (int)lVar7 + 1;
              bVar1 = ""[lVar7];
              iVar8 = stbi__extend_receive(j,uVar3 & 0xf);
              *(short *)((long)data + (ulong)((uint)bVar1 * 2)) =
                   (short)iVar8 * *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
            }
          }
          else {
            uVar3 = uVar2 & 0xf;
            if (j->code_bits < (int)uVar3) {
LAB_0014e481:
              stbi__g_failure_reason = "bad huffman code";
              return 0;
            }
            lVar7 = (ulong)(uVar2 >> 4 & 0xf) + (long)iVar4;
            j->code_buffer = j->code_buffer << (sbyte)uVar3;
            j->code_bits = j->code_bits - uVar3;
            iVar4 = (int)lVar7 + 1;
            *(short *)((long)data + (ulong)((uint)""[lVar7] * 2)) =
                 (short)(char)(uVar2 >> 8) *
                 *(short *)((long)dequant + (ulong)((uint)""[lVar7] * 2));
          }
          if (0x3f < iVar4) {
            return 1;
          }
        } while( true );
      }
      pcVar6 = "can\'t merge dc and ac";
    }
  }
  stbi__g_failure_reason = pcVar6;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b, stbi__uint16 *dequant)
{
   int diff,dc,k;
   int t;

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
   t = stbi__jpeg_huff_decode(j, hdc);
   if (t < 0 || t > 15) return stbi__err("bad huffman code","Corrupt JPEG");

   // 0 all the ac values now so we can do it 32-bits at a time
   memset(data,0,64*sizeof(data[0]));

   diff = t ? stbi__extend_receive(j, t) : 0;
   if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta","Corrupt JPEG");
   dc = j->img_comp[b].dc_pred + diff;
   j->img_comp[b].dc_pred = dc;
   if (!stbi__mul2shorts_valid(dc, dequant[0])) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
   data[0] = (short) (dc * dequant[0]);

   // decode AC components, see JPEG spec
   k = 1;
   do {
      unsigned int zig;
      int c,r,s;
      if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
      c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
      r = fac[c];
      if (r) { // fast-AC path
         k += (r >> 4) & 15; // run
         s = r & 15; // combined length
         if (s > j->code_bits) return stbi__err("bad huffman code", "Combined length longer than code bits available");
         j->code_buffer <<= s;
         j->code_bits -= s;
         // decode into unzigzag'd location
         zig = stbi__jpeg_dezigzag[k++];
         data[zig] = (short) ((r >> 8) * dequant[zig]);
      } else {
         int rs = stbi__jpeg_huff_decode(j, hac);
         if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
         s = rs & 15;
         r = rs >> 4;
         if (s == 0) {
            if (rs != 0xf0) break; // end block
            k += 16;
         } else {
            k += r;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) (stbi__extend_receive(j,s) * dequant[zig]);
         }
      }
   } while (k < 64);
   return 1;
}